

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FundamentalOperationalData *this)

{
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"FundamentalOperationalData:",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"\tNOT IMPLEMENTED YET\n",0x15);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

KString FundamentalOperationalData::GetAsString() const
{
    KStringStream ss;

    ss << "FundamentalOperationalData:"
       << "\tNOT IMPLEMENTED YET\n";

    // TODO: Get string for a specific system type.

    return ss.str();
}